

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermo.cpp
# Opt level: O3

void __thiscall
IO::Thermo::setLowerTemperatureCoefficients
          (Thermo *this,double al1,double al2,double al3,double al4,double al5,double al6,double al7
          )

{
  vector<double,_std::allocator<double>_> *this_00;
  double *pdVar1;
  iterator iVar2;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2._M_current =
       (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current != pdVar1) {
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
    iVar2._M_current = pdVar1;
  }
  this_00 = &this->al_;
  pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_50 = al7;
  local_48 = al6;
  local_40 = al5;
  local_38 = al4;
  local_30 = al3;
  local_20 = al2;
  local_18 = al1;
  if (iVar2._M_current == pdVar1) {
    local_28 = al2;
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_18);
    iVar2._M_current =
         (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    al2 = local_28;
  }
  else {
    *iVar2._M_current = al1;
    iVar2._M_current = iVar2._M_current + 1;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == pdVar1) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_20);
    iVar2._M_current =
         (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = al2;
    iVar2._M_current = iVar2._M_current + 1;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == pdVar1) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_30);
    iVar2._M_current =
         (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = local_30;
    iVar2._M_current = iVar2._M_current + 1;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == pdVar1) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_38);
    iVar2._M_current =
         (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = local_38;
    iVar2._M_current = iVar2._M_current + 1;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == pdVar1) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_40);
    iVar2._M_current =
         (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = local_40;
    iVar2._M_current = iVar2._M_current + 1;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == pdVar1) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_48);
    iVar2._M_current =
         (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = local_48;
    iVar2._M_current = iVar2._M_current + 1;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == pdVar1) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar2,&local_50);
  }
  else {
    *iVar2._M_current = local_50;
    (this->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void IO::Thermo::setLowerTemperatureCoefficients(
        double al1, double al2, double al3,
        double al4, double al5,
        double al6, double al7) {
    al_.clear();
    al_.push_back(al1);
    al_.push_back(al2);
    al_.push_back(al3);
    al_.push_back(al4);
    al_.push_back(al5);
    al_.push_back(al6);
    al_.push_back(al7);
}